

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parse_expression(Parser *this)

{
  AbstractSyntaxNode *pAVar1;
  Type local_c;
  
  local_c = kExpression;
  pAVar1 = AbstractSyntaxNode::add_child
                     (this->current_,&local_c,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar1;
  while( true ) {
    parse_term(this);
    if (((this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
         super__Vector_impl_data._M_start[this->index_ % this->total_].type_ & ~kRead) != kPlus)
    break;
    parse_add_op(this);
  }
  this->current_ = this->current_->parent_;
  return;
}

Assistant:

void Parser::parse_expression() {
    current_ = current_->add_child(Token::Type::kExpression, forward_token());

    parse_term();
    while (is_add_op(forward_token().type())) {
        parse_add_op();
        parse_term();
    }

    current_ = current_->parent();
}